

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Cnf_AddSorder(sat_solver *p,int *pVars,int i,int k,int *pnVars)

{
  int iVar;
  
  iVar = *pnVars;
  *pnVars = iVar + 2;
  sat_solver_add_and(p,iVar,pVars[i],pVars[k],1,1,1);
  sat_solver_add_and(p,iVar + 1,pVars[i],pVars[k],0,0,0);
  pVars[i] = iVar;
  pVars[k] = iVar + 1;
  return;
}

Assistant:

static inline void Cnf_AddSorder( sat_solver * p, int * pVars, int i, int k, int * pnVars )
{
    int iVar1 = (*pnVars)++;
    int iVar2 = (*pnVars)++;
    sat_solver_add_and( p, iVar1, pVars[i], pVars[k], 1, 1, 1 );
    sat_solver_add_and( p, iVar2, pVars[i], pVars[k], 0, 0, 0 );
    pVars[i] = iVar1;
    pVars[k] = iVar2;
}